

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha384-512.c
# Opt level: O3

void SHA384_512Finalize(SHA512Context *context,uint8_t Pad_Byte)

{
  uint8_t *puVar1;
  short sVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  
  lVar6 = (long)context->Message_Block_Index;
  puVar1 = context->Message_Block;
  iVar5 = context->Message_Block_Index + 1;
  context->Message_Block_Index = (short)iVar5;
  if (lVar6 < 0x70) {
    puVar1[lVar6] = Pad_Byte;
  }
  else {
    puVar1[lVar6] = Pad_Byte;
    if ((short)iVar5 < 0x80) {
      do {
        context->Message_Block_Index = (short)iVar5 + 1;
        context->Message_Block[(short)iVar5] = '\0';
        iVar5 = (int)context->Message_Block_Index;
      } while (iVar5 < 0x80);
    }
    SHA384_512ProcessMessageBlock(context);
  }
  sVar2 = context->Message_Block_Index;
  while (sVar2 < 0x70) {
    context->Message_Block_Index = sVar2 + 1;
    context->Message_Block[sVar2] = '\0';
    sVar2 = context->Message_Block_Index;
  }
  uVar3 = context->Length_Low;
  uVar4 = context->Length_High;
  *(ulong *)(context->Message_Block + 0x70) =
       uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
       (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
       (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
  *(ulong *)(context->Message_Block + 0x78) =
       uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
       (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
       (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  SHA384_512ProcessMessageBlock(context);
  context->Message_Block[0x70] = '\0';
  context->Message_Block[0x71] = '\0';
  context->Message_Block[0x72] = '\0';
  context->Message_Block[0x73] = '\0';
  context->Message_Block[0x74] = '\0';
  context->Message_Block[0x75] = '\0';
  context->Message_Block[0x76] = '\0';
  context->Message_Block[0x77] = '\0';
  context->Message_Block[0x78] = '\0';
  context->Message_Block[0x79] = '\0';
  context->Message_Block[0x7a] = '\0';
  context->Message_Block[0x7b] = '\0';
  context->Message_Block[0x7c] = '\0';
  context->Message_Block[0x7d] = '\0';
  context->Message_Block[0x7e] = '\0';
  context->Message_Block[0x7f] = '\0';
  context->Message_Block[0x60] = '\0';
  context->Message_Block[0x61] = '\0';
  context->Message_Block[0x62] = '\0';
  context->Message_Block[99] = '\0';
  context->Message_Block[100] = '\0';
  context->Message_Block[0x65] = '\0';
  context->Message_Block[0x66] = '\0';
  context->Message_Block[0x67] = '\0';
  context->Message_Block[0x68] = '\0';
  context->Message_Block[0x69] = '\0';
  context->Message_Block[0x6a] = '\0';
  context->Message_Block[0x6b] = '\0';
  context->Message_Block[0x6c] = '\0';
  context->Message_Block[0x6d] = '\0';
  context->Message_Block[0x6e] = '\0';
  context->Message_Block[0x6f] = '\0';
  context->Message_Block[0x50] = '\0';
  context->Message_Block[0x51] = '\0';
  context->Message_Block[0x52] = '\0';
  context->Message_Block[0x53] = '\0';
  context->Message_Block[0x54] = '\0';
  context->Message_Block[0x55] = '\0';
  context->Message_Block[0x56] = '\0';
  context->Message_Block[0x57] = '\0';
  context->Message_Block[0x58] = '\0';
  context->Message_Block[0x59] = '\0';
  context->Message_Block[0x5a] = '\0';
  context->Message_Block[0x5b] = '\0';
  context->Message_Block[0x5c] = '\0';
  context->Message_Block[0x5d] = '\0';
  context->Message_Block[0x5e] = '\0';
  context->Message_Block[0x5f] = '\0';
  context->Message_Block[0x40] = '\0';
  context->Message_Block[0x41] = '\0';
  context->Message_Block[0x42] = '\0';
  context->Message_Block[0x43] = '\0';
  context->Message_Block[0x44] = '\0';
  context->Message_Block[0x45] = '\0';
  context->Message_Block[0x46] = '\0';
  context->Message_Block[0x47] = '\0';
  context->Message_Block[0x48] = '\0';
  context->Message_Block[0x49] = '\0';
  context->Message_Block[0x4a] = '\0';
  context->Message_Block[0x4b] = '\0';
  context->Message_Block[0x4c] = '\0';
  context->Message_Block[0x4d] = '\0';
  context->Message_Block[0x4e] = '\0';
  context->Message_Block[0x4f] = '\0';
  context->Message_Block[0x30] = '\0';
  context->Message_Block[0x31] = '\0';
  context->Message_Block[0x32] = '\0';
  context->Message_Block[0x33] = '\0';
  context->Message_Block[0x34] = '\0';
  context->Message_Block[0x35] = '\0';
  context->Message_Block[0x36] = '\0';
  context->Message_Block[0x37] = '\0';
  context->Message_Block[0x38] = '\0';
  context->Message_Block[0x39] = '\0';
  context->Message_Block[0x3a] = '\0';
  context->Message_Block[0x3b] = '\0';
  context->Message_Block[0x3c] = '\0';
  context->Message_Block[0x3d] = '\0';
  context->Message_Block[0x3e] = '\0';
  context->Message_Block[0x3f] = '\0';
  context->Message_Block[0x20] = '\0';
  context->Message_Block[0x21] = '\0';
  context->Message_Block[0x22] = '\0';
  context->Message_Block[0x23] = '\0';
  context->Message_Block[0x24] = '\0';
  context->Message_Block[0x25] = '\0';
  context->Message_Block[0x26] = '\0';
  context->Message_Block[0x27] = '\0';
  context->Message_Block[0x28] = '\0';
  context->Message_Block[0x29] = '\0';
  context->Message_Block[0x2a] = '\0';
  context->Message_Block[0x2b] = '\0';
  context->Message_Block[0x2c] = '\0';
  context->Message_Block[0x2d] = '\0';
  context->Message_Block[0x2e] = '\0';
  context->Message_Block[0x2f] = '\0';
  context->Message_Block[0x10] = '\0';
  context->Message_Block[0x11] = '\0';
  context->Message_Block[0x12] = '\0';
  context->Message_Block[0x13] = '\0';
  context->Message_Block[0x14] = '\0';
  context->Message_Block[0x15] = '\0';
  context->Message_Block[0x16] = '\0';
  context->Message_Block[0x17] = '\0';
  context->Message_Block[0x18] = '\0';
  context->Message_Block[0x19] = '\0';
  context->Message_Block[0x1a] = '\0';
  context->Message_Block[0x1b] = '\0';
  context->Message_Block[0x1c] = '\0';
  context->Message_Block[0x1d] = '\0';
  context->Message_Block[0x1e] = '\0';
  context->Message_Block[0x1f] = '\0';
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  context->Message_Block[8] = '\0';
  context->Message_Block[9] = '\0';
  context->Message_Block[10] = '\0';
  context->Message_Block[0xb] = '\0';
  context->Message_Block[0xc] = '\0';
  context->Message_Block[0xd] = '\0';
  context->Message_Block[0xe] = '\0';
  context->Message_Block[0xf] = '\0';
  context->Length_Low = 0;
  context->Length_High = 0;
  context->Computed = 1;
  return;
}

Assistant:

static void SHA384_512Finalize(SHA512Context *context,
    uint8_t Pad_Byte)
{
    int_least16_t i;
    SHA384_512PadMessage(context, Pad_Byte);
    /* message may be sensitive, clear it out */
    for (i = 0; i < SHA512_Message_Block_Size; ++i)
        context->Message_Block[i] = 0;
#ifdef USE_32BIT_ONLY    /* and clear length */
    context->Length[0] = context->Length[1] = 0;
    context->Length[2] = context->Length[3] = 0;
#else /* !USE_32BIT_ONLY */
    context->Length_Low = 0;
    context->Length_High = 0;
#endif /* USE_32BIT_ONLY */
    context->Computed = 1;
}